

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O2

void ncnn::pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined4 *puVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  size_t *psVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  undefined1 (*pauVar29) [64];
  void *pvVar30;
  long lVar31;
  undefined1 (*pauVar32) [16];
  undefined1 (*pauVar33) [32];
  long lVar34;
  int iVar35;
  long lVar36;
  undefined1 (*pauVar37) [64];
  long lVar38;
  undefined1 (*pauVar39) [64];
  long lVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  bool bVar50;
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  long local_160;
  long local_158;
  long local_150;
  long local_128;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_d0;
  long local_c8;
  long local_c0;
  
  psVar24 = (size_t *)&A->w;
  if (A->dims == 3) {
    psVar24 = &A->cstep;
  }
  lVar45 = (long)(int)*psVar24;
  local_c0 = 0;
  iVar47 = 0;
  if (0 < max_kk) {
    iVar47 = max_kk;
  }
  lVar38 = (long)i;
  lVar25 = lVar45 * lVar38;
  lVar7 = (long)k * 4;
  lVar31 = lVar7 + (lVar38 + 1) * lVar45 * 4;
  lVar34 = lVar7 + (lVar38 + 2) * lVar45 * 4;
  lVar43 = lVar7 + (lVar38 + 3) * lVar45 * 4;
  lVar40 = (lVar38 + 4) * lVar45;
  local_d0 = (long)(k * 4) * 4;
  local_150 = local_d0 + lVar40 * 4;
  lVar40 = lVar7 + lVar40 * 4;
  lVar1 = lVar7 + (lVar38 + 5) * lVar45 * 4;
  lVar2 = lVar7 + (lVar38 + 6) * lVar45 * 4;
  lVar3 = lVar7 + (lVar38 + 7) * lVar45 * 4;
  lVar41 = (lVar38 + 8) * lVar45;
  lVar4 = lVar7 + lVar25 * 4;
  lVar36 = local_d0 + lVar25 * 4;
  lVar44 = (long)(k * 8) * 4;
  lVar25 = lVar44 + lVar25 * 4;
  lVar44 = lVar44 + lVar41 * 4;
  lVar26 = (lVar38 + 0xc) * lVar45;
  local_c8 = local_d0 + lVar26 * 4;
  local_d0 = local_d0 + lVar41 * 4;
  pauVar39 = (undefined1 (*) [64])AT->data;
  lVar27 = (long)max_ii;
  lVar28 = lVar45 * 0x40;
  iVar17 = A->elempack;
  lVar49 = lVar4;
  local_160 = lVar34;
  local_158 = lVar31;
  local_128 = lVar43;
  local_100 = lVar40;
  local_f8 = lVar1;
  local_f0 = lVar2;
  local_e8 = lVar3;
  for (uVar42 = 0; (long)(uVar42 | 0xf) < lVar27; uVar42 = uVar42 + 0x10) {
    pauVar37 = pauVar39;
    if (iVar17 == 0x10) {
      pauVar29 = (undefined1 (*) [64])
                 ((long)A->data + (long)(k << 4) * 4 + (lVar38 + uVar42) * lVar45 * 4);
      iVar35 = iVar47;
      while (bVar50 = iVar35 != 0, iVar35 = iVar35 + -1, pauVar37 = pauVar39, bVar50) {
        *pauVar39 = *pauVar29;
        pauVar39 = pauVar39 + 1;
        pauVar29 = pauVar29 + 1;
      }
    }
    if (iVar17 == 8) {
      pvVar30 = A->data;
      iVar35 = iVar47;
      while (bVar50 = iVar35 != 0, iVar35 = iVar35 + -1, bVar50) {
        puVar5 = (undefined8 *)((long)pvVar30 + lVar25);
        uVar21 = puVar5[1];
        uVar22 = puVar5[2];
        uVar23 = puVar5[3];
        *(undefined8 *)*pauVar37 = *puVar5;
        *(undefined8 *)(*pauVar37 + 8) = uVar21;
        *(undefined8 *)(*pauVar37 + 0x10) = uVar22;
        *(undefined8 *)(*pauVar37 + 0x18) = uVar23;
        *(undefined1 (*) [32])(*pauVar37 + 0x20) = *(undefined1 (*) [32])((long)pvVar30 + lVar44);
        pauVar37 = pauVar37 + 1;
        pvVar30 = (void *)((long)pvVar30 + 0x20);
      }
    }
    pauVar39 = pauVar37;
    if (iVar17 == 4) {
      pvVar30 = A->data;
      lVar46 = 0;
      iVar35 = iVar47;
      while (bVar50 = iVar35 != 0, iVar35 = iVar35 + -1, bVar50) {
        puVar5 = (undefined8 *)((long)pvVar30 + lVar46 + lVar36);
        uVar21 = puVar5[1];
        *(undefined8 *)(*pauVar37 + lVar46 * 4) = *puVar5;
        *(undefined8 *)((long)(*pauVar37 + lVar46 * 4) + 8) = uVar21;
        puVar5 = (undefined8 *)((long)pvVar30 + lVar46 + local_150);
        uVar21 = puVar5[1];
        *(undefined8 *)(*pauVar37 + lVar46 * 4 + 0x10) = *puVar5;
        *(undefined8 *)((long)(*pauVar37 + lVar46 * 4 + 0x10) + 8) = uVar21;
        puVar5 = (undefined8 *)((long)pvVar30 + lVar46 + local_d0);
        uVar21 = puVar5[1];
        *(undefined8 *)(*pauVar37 + lVar46 * 4 + 0x20) = *puVar5;
        *(undefined8 *)((long)(*pauVar37 + lVar46 * 4 + 0x20) + 8) = uVar21;
        *(undefined1 (*) [16])(*pauVar37 + lVar46 * 4 + 0x30) =
             *(undefined1 (*) [16])((long)pvVar30 + lVar46 + local_c8);
        pauVar39 = pauVar39 + 1;
        lVar46 = lVar46 + 0x10;
      }
    }
    if (iVar17 == 1) {
      pvVar30 = A->data;
      lVar46 = (long)pvVar30 + local_c0;
      lVar48 = 0;
      for (iVar35 = 0; iVar35 + 0xf < max_kk; iVar35 = iVar35 + 0x10) {
        auVar52 = *(undefined1 (*) [64])(lVar46 + lVar4);
        auVar53 = *(undefined1 (*) [64])(lVar46 + lVar31);
        auVar54 = *(undefined1 (*) [64])(lVar46 + lVar34);
        auVar55 = *(undefined1 (*) [64])(lVar46 + lVar43);
        auVar56 = *(undefined1 (*) [64])(lVar46 + lVar40);
        auVar57 = *(undefined1 (*) [64])(lVar46 + lVar1);
        auVar58 = *(undefined1 (*) [64])(lVar46 + lVar2);
        auVar59 = *(undefined1 (*) [64])(lVar46 + lVar3);
        auVar60 = *(undefined1 (*) [64])(lVar46 + lVar7 + lVar41 * 4);
        auVar61 = *(undefined1 (*) [64])(lVar46 + lVar7 + (lVar38 + 9) * lVar45 * 4);
        auVar62 = *(undefined1 (*) [64])(lVar46 + lVar7 + (lVar38 + 10) * lVar45 * 4);
        auVar63 = *(undefined1 (*) [64])(lVar46 + lVar7 + (lVar38 + 0xb) * lVar45 * 4);
        auVar64 = *(undefined1 (*) [64])(lVar46 + lVar7 + lVar26 * 4);
        auVar65 = *(undefined1 (*) [64])(lVar46 + lVar7 + (lVar38 + 0xd) * lVar45 * 4);
        auVar66 = *(undefined1 (*) [64])(lVar46 + lVar7 + (lVar38 + 0xe) * lVar45 * 4);
        auVar67 = *(undefined1 (*) [64])(lVar46 + lVar7 + (lVar38 + 0xf) * lVar45 * 4);
        auVar51 = vunpcklps_avx512f(auVar52,auVar53);
        auVar52 = vunpckhps_avx512f(auVar52,auVar53);
        auVar53 = vunpcklps_avx512f(auVar54,auVar55);
        auVar54 = vunpckhps_avx512f(auVar54,auVar55);
        auVar55 = vunpcklps_avx512f(auVar56,auVar57);
        auVar56 = vunpckhps_avx512f(auVar56,auVar57);
        auVar57 = vunpcklps_avx512f(auVar58,auVar59);
        auVar58 = vunpckhps_avx512f(auVar58,auVar59);
        auVar59 = vunpcklps_avx512f(auVar60,auVar61);
        auVar60 = vunpckhps_avx512f(auVar60,auVar61);
        auVar61 = vunpcklps_avx512f(auVar62,auVar63);
        auVar62 = vunpckhps_avx512f(auVar62,auVar63);
        auVar63 = vunpcklps_avx512f(auVar64,auVar65);
        auVar64 = vunpckhps_avx512f(auVar64,auVar65);
        auVar65 = vunpcklps_avx512f(auVar66,auVar67);
        auVar66 = vunpckhps_avx512f(auVar66,auVar67);
        auVar67 = vunpcklpd_avx512f(auVar51,auVar53);
        auVar53 = vunpckhpd_avx512f(auVar51,auVar53);
        auVar51 = vunpcklpd_avx512f(auVar52,auVar54);
        auVar52 = vunpckhpd_avx512f(auVar52,auVar54);
        auVar54 = vunpcklpd_avx512f(auVar55,auVar57);
        auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
        auVar57 = vunpcklpd_avx512f(auVar56,auVar58);
        auVar56 = vunpckhpd_avx512f(auVar56,auVar58);
        auVar58 = vunpcklpd_avx512f(auVar59,auVar61);
        auVar59 = vunpckhpd_avx512f(auVar59,auVar61);
        auVar61 = vunpcklpd_avx512f(auVar60,auVar62);
        auVar60 = vunpckhpd_avx512f(auVar60,auVar62);
        auVar62 = vunpcklpd_avx512f(auVar63,auVar65);
        auVar63 = vunpckhpd_avx512f(auVar63,auVar65);
        auVar65 = vunpcklpd_avx512f(auVar64,auVar66);
        auVar64 = vunpckhpd_avx512f(auVar64,auVar66);
        auVar66 = vshuff64x2_avx512f(auVar67,auVar54,0x88);
        auVar68 = vshuff64x2_avx512f(auVar58,auVar62,0x88);
        auVar69 = vshuff64x2_avx512f(auVar53,auVar55,0x88);
        auVar70 = vshuff64x2_avx512f(auVar59,auVar63,0x88);
        auVar71 = vshuff64x2_avx512f(auVar51,auVar57,0x88);
        auVar72 = vshuff64x2_avx512f(auVar61,auVar65,0x88);
        auVar73 = vshuff64x2_avx512f(auVar52,auVar56,0x88);
        auVar74 = vshuff64x2_avx512f(auVar60,auVar64,0x88);
        auVar54 = vshuff64x2_avx512f(auVar67,auVar54,0xdd);
        auVar58 = vshuff64x2_avx512f(auVar58,auVar62,0xdd);
        auVar53 = vshuff64x2_avx512f(auVar53,auVar55,0xdd);
        auVar55 = vshuff64x2_avx512f(auVar59,auVar63,0xdd);
        auVar57 = vshuff64x2_avx512f(auVar51,auVar57,0xdd);
        auVar59 = vshuff64x2_avx512f(auVar61,auVar65,0xdd);
        auVar52 = vshuff64x2_avx512f(auVar52,auVar56,0xdd);
        auVar56 = vshuff64x2_avx512f(auVar60,auVar64,0xdd);
        auVar60 = vshuff64x2_avx512f(auVar66,auVar68,0x88);
        auVar61 = vshuff64x2_avx512f(auVar69,auVar70,0x88);
        auVar62 = vshuff64x2_avx512f(auVar71,auVar72,0x88);
        auVar63 = vshuff64x2_avx512f(auVar73,auVar74,0x88);
        auVar64 = vshuff64x2_avx512f(auVar54,auVar58,0x88);
        auVar65 = vshuff64x2_avx512f(auVar53,auVar55,0x88);
        auVar67 = vshuff64x2_avx512f(auVar57,auVar59,0x88);
        auVar51 = vshuff64x2_avx512f(auVar52,auVar56,0x88);
        auVar66 = vshuff64x2_avx512f(auVar66,auVar68,0xdd);
        auVar68 = vshuff64x2_avx512f(auVar69,auVar70,0xdd);
        auVar69 = vshuff64x2_avx512f(auVar71,auVar72,0xdd);
        auVar70 = vshuff64x2_avx512f(auVar73,auVar74,0xdd);
        auVar54 = vshuff64x2_avx512f(auVar54,auVar58,0xdd);
        auVar53 = vshuff64x2_avx512f(auVar53,auVar55,0xdd);
        auVar55 = vshuff64x2_avx512f(auVar57,auVar59,0xdd);
        auVar52 = vshuff64x2_avx512f(auVar52,auVar56,0xdd);
        *pauVar39 = auVar60;
        pauVar39[1] = auVar61;
        pauVar39[2] = auVar62;
        pauVar39[3] = auVar63;
        pauVar39[4] = auVar64;
        pauVar39[5] = auVar65;
        pauVar39[6] = auVar67;
        pauVar39[7] = auVar51;
        pauVar39[8] = auVar66;
        pauVar39[9] = auVar68;
        pauVar39[10] = auVar69;
        pauVar39[0xb] = auVar70;
        pauVar39[0xc] = auVar54;
        pauVar39[0xd] = auVar53;
        pauVar39[0xe] = auVar55;
        pauVar39[0xf] = auVar52;
        pauVar39 = pauVar39 + 0x10;
        lVar46 = lVar46 + 0x40;
        lVar48 = lVar48 + 0x10;
      }
      for (; (int)lVar48 < max_kk; lVar48 = lVar48 + 1) {
        puVar6 = (undefined4 *)((long)pvVar30 + lVar48 * 4 + lVar49);
        *(undefined4 *)*pauVar39 = *puVar6;
        *(undefined4 *)(*pauVar39 + 4) = puVar6[lVar45];
        *(undefined4 *)(*pauVar39 + 8) = puVar6[lVar45 * 2];
        *(undefined4 *)(*pauVar39 + 0xc) = puVar6[lVar45 * 3];
        *(undefined4 *)(*pauVar39 + 0x10) = puVar6[lVar45 * 4];
        *(undefined4 *)(*pauVar39 + 0x14) = puVar6[lVar45 * 5];
        *(undefined4 *)(*pauVar39 + 0x18) = puVar6[lVar45 * 6];
        *(undefined4 *)(*pauVar39 + 0x1c) = puVar6[lVar45 * 7];
        *(undefined4 *)(*pauVar39 + 0x20) = puVar6[lVar45 * 8];
        *(undefined4 *)(*pauVar39 + 0x24) = puVar6[lVar45 * 9];
        *(undefined4 *)(*pauVar39 + 0x28) = puVar6[lVar45 * 10];
        *(undefined4 *)(*pauVar39 + 0x2c) = puVar6[lVar45 * 0xb];
        *(undefined4 *)(*pauVar39 + 0x30) = puVar6[lVar45 * 0xc];
        *(undefined4 *)(*pauVar39 + 0x34) = puVar6[lVar45 * 0xd];
        *(undefined4 *)(*pauVar39 + 0x38) = puVar6[lVar45 * 0xe];
        *(undefined4 *)(*pauVar39 + 0x3c) = puVar6[lVar45 * 0xf];
        pauVar39 = pauVar39 + 1;
      }
    }
    lVar49 = lVar49 + lVar28;
    local_158 = local_158 + lVar28;
    local_160 = local_160 + lVar28;
    local_128 = local_128 + lVar28;
    lVar36 = lVar36 + lVar28;
    local_150 = local_150 + lVar28;
    local_100 = local_100 + lVar28;
    local_f8 = local_f8 + lVar28;
    local_f0 = local_f0 + lVar28;
    local_e8 = local_e8 + lVar28;
    lVar44 = lVar44 + lVar28;
    lVar25 = lVar25 + lVar28;
    local_c8 = local_c8 + lVar28;
    local_d0 = local_d0 + lVar28;
    local_c0 = local_c0 + lVar28;
  }
  lVar31 = lVar45 * 0x20;
  for (; (long)(uVar42 | 7) < lVar27; uVar42 = uVar42 + 8) {
    if (iVar17 == 8) {
      pauVar33 = (undefined1 (*) [32])
                 ((long)A->data + (long)(k * 8) * 4 + (lVar38 + uVar42) * lVar45 * 4);
      iVar35 = iVar47;
      while (bVar50 = iVar35 != 0, iVar35 = iVar35 + -1, bVar50) {
        *(undefined1 (*) [32])*pauVar39 = *pauVar33;
        pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x20);
        pauVar33 = pauVar33 + 1;
      }
    }
    if (iVar17 == 4) {
      pvVar30 = A->data;
      iVar35 = iVar47;
      while (bVar50 = iVar35 != 0, iVar35 = iVar35 + -1, bVar50) {
        uVar21 = ((undefined8 *)((long)pvVar30 + lVar36))[1];
        *(undefined8 *)*pauVar39 = *(undefined8 *)((long)pvVar30 + lVar36);
        *(undefined8 *)(*pauVar39 + 8) = uVar21;
        *(undefined1 (*) [16])(*pauVar39 + 0x10) = *(undefined1 (*) [16])((long)pvVar30 + local_150)
        ;
        pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x20);
        pvVar30 = (void *)((long)pvVar30 + 0x10);
      }
    }
    if (iVar17 == 1) {
      pvVar30 = A->data;
      lVar43 = 0;
      lVar34 = 0;
      pauVar37 = pauVar39;
      for (iVar35 = 0; iVar35 + 7 < max_kk; iVar35 = iVar35 + 8) {
        auVar12 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + lVar49);
        auVar75 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + local_158);
        auVar76 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + local_160);
        auVar13 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + local_128);
        auVar14 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + local_100);
        auVar77 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + local_f8);
        auVar15 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + local_f0);
        auVar16 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + local_e8);
        auVar20 = vunpcklps_avx(auVar12,auVar75);
        auVar75 = vunpckhps_avx(auVar12,auVar75);
        auVar12 = vunpcklps_avx(auVar76,auVar13);
        auVar76 = vunpckhps_avx(auVar76,auVar13);
        auVar78 = vunpcklps_avx(auVar14,auVar77);
        auVar13 = vunpckhps_avx(auVar14,auVar77);
        auVar79 = vunpcklps_avx(auVar15,auVar16);
        auVar14 = vunpckhps_avx(auVar15,auVar16);
        auVar77 = vunpcklpd_avx(auVar20,auVar12);
        auVar12 = vunpckhpd_avx(auVar20,auVar12);
        auVar15 = vunpcklpd_avx(auVar75,auVar76);
        auVar75 = vunpckhpd_avx(auVar75,auVar76);
        auVar16 = vunpcklpd_avx(auVar78,auVar79);
        auVar76 = vunpckhpd_avx(auVar78,auVar79);
        auVar20 = vunpcklpd_avx(auVar13,auVar14);
        auVar13 = vunpckhpd_avx(auVar13,auVar14);
        auVar78._16_16_ = auVar16._0_16_;
        auVar78._0_16_ = auVar77._0_16_;
        auVar79._16_16_ = auVar76._0_16_;
        auVar79._0_16_ = auVar12._0_16_;
        auVar80._16_16_ = auVar20._0_16_;
        auVar80._0_16_ = auVar15._0_16_;
        auVar81._16_16_ = auVar13._0_16_;
        auVar81._0_16_ = auVar75._0_16_;
        auVar14 = vperm2f128_avx(auVar77,auVar16,0x31);
        auVar12 = vperm2f128_avx(auVar12,auVar76,0x31);
        auVar76 = vperm2f128_avx(auVar15,auVar20,0x31);
        auVar75 = vperm2f128_avx(auVar75,auVar13,0x31);
        *(undefined1 (*) [32])(*pauVar39 + lVar34 * 8) = auVar78;
        *(undefined1 (*) [32])(*pauVar39 + lVar34 * 8 + 0x20) = auVar79;
        *(undefined1 (*) [32])(pauVar39[1] + lVar34 * 8) = auVar80;
        *(undefined1 (*) [32])(pauVar39[1] + lVar34 * 8 + 0x20) = auVar81;
        *(undefined1 (*) [32])(pauVar39[2] + lVar34 * 8) = auVar14;
        *(undefined1 (*) [32])(pauVar39[2] + lVar34 * 8 + 0x20) = auVar12;
        *(undefined1 (*) [32])(pauVar39[3] + lVar34 * 8) = auVar76;
        *(undefined1 (*) [32])(pauVar39[3] + lVar34 * 8 + 0x20) = auVar75;
        pauVar37 = pauVar37 + 4;
        lVar34 = lVar34 + 0x20;
        lVar43 = lVar43 + 8;
      }
      for (; pauVar39 = pauVar37, (int)lVar43 < max_kk; lVar43 = lVar43 + 1) {
        puVar6 = (undefined4 *)((long)pvVar30 + lVar43 * 4 + lVar49);
        *(undefined4 *)*pauVar39 = *puVar6;
        *(undefined4 *)(*pauVar39 + 4) = puVar6[lVar45];
        *(undefined4 *)(*pauVar39 + 8) = puVar6[lVar45 * 2];
        *(undefined4 *)(*pauVar39 + 0xc) = puVar6[lVar45 * 3];
        *(undefined4 *)(*pauVar39 + 0x10) = puVar6[lVar45 * 4];
        *(undefined4 *)(*pauVar39 + 0x14) = puVar6[lVar45 * 5];
        *(undefined4 *)(*pauVar39 + 0x18) = puVar6[lVar45 * 6];
        *(undefined4 *)(*pauVar39 + 0x1c) = puVar6[lVar45 * 7];
        pauVar37 = (undefined1 (*) [64])(*pauVar39 + 0x20);
      }
    }
    lVar49 = lVar49 + lVar31;
    local_158 = local_158 + lVar31;
    local_160 = local_160 + lVar31;
    local_128 = local_128 + lVar31;
    lVar36 = lVar36 + lVar31;
    local_150 = local_150 + lVar31;
    local_100 = local_100 + lVar31;
    local_f8 = local_f8 + lVar31;
    local_f0 = local_f0 + lVar31;
    local_e8 = local_e8 + lVar31;
  }
  lVar31 = lVar45 * 0x10;
  for (; (long)(uVar42 | 3) < lVar27; uVar42 = uVar42 + 4) {
    if (iVar17 == 4) {
      pauVar32 = (undefined1 (*) [16])
                 ((long)A->data + (long)(k * 4) * 4 + (lVar38 + uVar42) * lVar45 * 4);
      iVar35 = iVar47;
      while (bVar50 = iVar35 != 0, iVar35 = iVar35 + -1, bVar50) {
        *(undefined1 (*) [16])*pauVar39 = *pauVar32;
        pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x10);
        pauVar32 = pauVar32 + 1;
      }
    }
    pauVar37 = pauVar39;
    if (iVar17 == 1) {
      pvVar30 = A->data;
      lVar34 = 0;
      for (iVar35 = 0; iVar35 + 7 < max_kk; iVar35 = iVar35 + 8) {
        auVar12 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + lVar49);
        auVar75 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + local_158);
        auVar76 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + local_160);
        auVar13 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + local_128);
        auVar14 = vunpcklps_avx(auVar12,auVar75);
        auVar75 = vunpckhps_avx(auVar12,auVar75);
        auVar12 = vunpcklps_avx(auVar76,auVar13);
        auVar76 = vunpckhps_avx(auVar76,auVar13);
        auVar13 = vunpcklpd_avx(auVar14,auVar12);
        auVar12 = vunpckhpd_avx(auVar14,auVar12);
        auVar14 = vunpcklpd_avx(auVar75,auVar76);
        auVar75 = vunpckhpd_avx(auVar75,auVar76);
        auVar76._16_16_ = auVar12._0_16_;
        auVar76._0_16_ = auVar13._0_16_;
        auVar77._16_16_ = auVar75._0_16_;
        auVar77._0_16_ = auVar14._0_16_;
        auVar12 = vperm2f128_avx(auVar13,auVar12,0x31);
        auVar75 = vperm2f128_avx(auVar14,auVar75,0x31);
        *(undefined1 (*) [32])(*pauVar39 + lVar34 * 4) = auVar76;
        *(undefined1 (*) [32])(*pauVar39 + lVar34 * 4 + 0x20) = auVar77;
        *(undefined1 (*) [32])(pauVar39[1] + lVar34 * 4) = auVar12;
        *(undefined1 (*) [32])(pauVar39[1] + lVar34 * 4 + 0x20) = auVar75;
        pauVar37 = pauVar37 + 2;
        lVar34 = lVar34 + 0x20;
      }
      for (; iVar35 + 3 < max_kk; iVar35 = iVar35 + 4) {
        auVar8 = *(undefined1 (*) [16])((long)pvVar30 + lVar34 + lVar49);
        auVar9 = *(undefined1 (*) [16])((long)pvVar30 + lVar34 + local_158);
        auVar10 = *(undefined1 (*) [16])((long)pvVar30 + lVar34 + local_160);
        auVar11 = *(undefined1 (*) [16])((long)pvVar30 + lVar34 + local_128);
        auVar18 = vunpcklps_avx(auVar8,auVar9);
        auVar19 = vunpcklps_avx(auVar10,auVar11);
        auVar9 = vunpckhps_avx(auVar8,auVar9);
        auVar10 = vunpckhps_avx(auVar10,auVar11);
        auVar11 = vunpcklpd_avx(auVar18,auVar19);
        auVar8 = vunpckhpd_avx(auVar18,auVar19);
        auVar18 = vunpcklpd_avx(auVar9,auVar10);
        auVar9 = vunpckhpd_avx(auVar9,auVar10);
        *(undefined1 (*) [16])(*pauVar39 + lVar34 * 4) = auVar11;
        *(undefined1 (*) [16])(*pauVar39 + lVar34 * 4 + 0x10) = auVar8;
        *(undefined1 (*) [16])(*pauVar39 + lVar34 * 4 + 0x20) = auVar18;
        *(undefined1 (*) [16])(*pauVar39 + lVar34 * 4 + 0x30) = auVar9;
        pauVar37 = pauVar37 + 1;
        lVar34 = lVar34 + 0x10;
      }
      for (; iVar35 < max_kk; iVar35 = iVar35 + 1) {
        *(undefined4 *)(*pauVar39 + lVar34 * 4) = *(undefined4 *)((long)pvVar30 + lVar34 + lVar49);
        *(undefined4 *)(*pauVar39 + lVar34 * 4 + 4) =
             *(undefined4 *)((long)pvVar30 + lVar34 + local_158);
        *(undefined4 *)(*pauVar39 + lVar34 * 4 + 8) =
             *(undefined4 *)((long)pvVar30 + lVar34 + local_160);
        *(undefined4 *)(*pauVar39 + lVar34 * 4 + 0xc) =
             *(undefined4 *)((long)pvVar30 + lVar34 + local_128);
        pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
        lVar34 = lVar34 + 4;
      }
    }
    lVar49 = lVar49 + lVar31;
    local_158 = local_158 + lVar31;
    local_160 = local_160 + lVar31;
    local_128 = local_128 + lVar31;
    pauVar39 = pauVar37;
  }
  for (; (long)(uVar42 | 1) < lVar27; uVar42 = uVar42 + 2) {
    pvVar30 = A->data;
    lVar31 = 0;
    lVar34 = 0;
    pauVar37 = pauVar39;
    for (iVar47 = 0; iVar47 + 7 < max_kk; iVar47 = iVar47 + 8) {
      auVar12 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + lVar49);
      auVar75 = *(undefined1 (*) [32])((long)pvVar30 + lVar34 + local_158);
      auVar76 = vunpcklps_avx(auVar12,auVar75);
      auVar12 = vunpckhps_avx(auVar12,auVar75);
      auVar75._16_16_ = auVar12._0_16_;
      auVar75._0_16_ = auVar76._0_16_;
      auVar12 = vperm2f128_avx(auVar76,auVar12,0x31);
      *(undefined1 (*) [32])(*pauVar39 + lVar34 * 2) = auVar75;
      *(undefined1 (*) [32])(*pauVar39 + lVar34 * 2 + 0x20) = auVar12;
      pauVar37 = pauVar37 + 1;
      lVar34 = lVar34 + 0x20;
      lVar31 = lVar31 + 8;
    }
    for (; iVar47 + 3 < max_kk; iVar47 = iVar47 + 4) {
      auVar8 = *(undefined1 (*) [16])((long)pvVar30 + lVar34 + lVar49);
      auVar9 = *(undefined1 (*) [16])((long)pvVar30 + lVar34 + local_158);
      auVar10 = vunpcklps_avx(auVar8,auVar9);
      auVar8 = vunpckhps_avx(auVar8,auVar9);
      *(undefined1 (*) [16])(*pauVar39 + lVar34 * 2) = auVar10;
      *(undefined1 (*) [16])(*pauVar39 + lVar34 * 2 + 0x10) = auVar8;
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
      lVar34 = lVar34 + 0x10;
      lVar31 = lVar31 + 4;
    }
    for (; (int)lVar31 < max_kk; lVar31 = lVar31 + 1) {
      *(undefined4 *)*pauVar37 = *(undefined4 *)((long)pvVar30 + lVar31 * 4 + lVar49);
      *(undefined4 *)(*pauVar37 + 4) = *(undefined4 *)((long)pvVar30 + lVar31 * 4 + local_158);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
    }
    lVar49 = lVar49 + lVar45 * 8;
    local_158 = local_158 + lVar45 * 8;
    pauVar39 = pauVar37;
  }
  for (; (long)uVar42 < lVar27; uVar42 = uVar42 + 1) {
    pvVar30 = A->data;
    pauVar33 = (undefined1 (*) [32])((long)pvVar30 + (long)k * 4 + (lVar38 + uVar42) * lVar45 * 4);
    lVar31 = 0;
    for (iVar47 = 0; iVar47 + 7 < max_kk; iVar47 = iVar47 + 8) {
      *(undefined1 (*) [32])*pauVar39 = *pauVar33;
      pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x20);
      pauVar33 = pauVar33 + 1;
      lVar31 = lVar31 + 8;
    }
    for (; iVar47 + 3 < max_kk; iVar47 = iVar47 + 4) {
      *(undefined1 (*) [16])*pauVar39 = *(undefined1 (*) [16])*pauVar33;
      pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x10);
      pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
      lVar31 = lVar31 + 4;
    }
    for (; (int)lVar31 < max_kk; lVar31 = lVar31 + 1) {
      *(undefined4 *)*pauVar39 = *(undefined4 *)((long)pvVar30 + lVar31 * 4 + lVar49);
      pauVar39 = (undefined1 (*) [64])(*pauVar39 + 4);
    }
    lVar49 = lVar49 + lVar45 * 4;
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 16;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;
            const float* p1 = (const float*)A + (i + ii + 8) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                _mm256_store_ps(pp + 8, _mm256_load_ps(p1));
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;
            const float* p2 = (const float*)A + (i + ii + 8) * A_hstep + k * 4;
            const float* p3 = (const float*)A + (i + ii + 12) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                _mm_store_ps(pp + 12, _mm_load_ps(p3));
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;
            const float* p8 = (const float*)A + (i + ii + 8) * A_hstep + k;
            const float* p9 = (const float*)A + (i + ii + 9) * A_hstep + k;
            const float* pa = (const float*)A + (i + ii + 10) * A_hstep + k;
            const float* pb = (const float*)A + (i + ii + 11) * A_hstep + k;
            const float* pc = (const float*)A + (i + ii + 12) * A_hstep + k;
            const float* pd = (const float*)A + (i + ii + 13) * A_hstep + k;
            const float* pe = (const float*)A + (i + ii + 14) * A_hstep + k;
            const float* pf = (const float*)A + (i + ii + 15) * A_hstep + k;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_loadu_ps(p0);
                __m512 _r1 = _mm512_loadu_ps(p1);
                __m512 _r2 = _mm512_loadu_ps(p2);
                __m512 _r3 = _mm512_loadu_ps(p3);
                __m512 _r4 = _mm512_loadu_ps(p4);
                __m512 _r5 = _mm512_loadu_ps(p5);
                __m512 _r6 = _mm512_loadu_ps(p6);
                __m512 _r7 = _mm512_loadu_ps(p7);
                __m512 _r8 = _mm512_loadu_ps(p8);
                __m512 _r9 = _mm512_loadu_ps(p9);
                __m512 _ra = _mm512_loadu_ps(pa);
                __m512 _rb = _mm512_loadu_ps(pb);
                __m512 _rc = _mm512_loadu_ps(pc);
                __m512 _rd = _mm512_loadu_ps(pd);
                __m512 _re = _mm512_loadu_ps(pe);
                __m512 _rf = _mm512_loadu_ps(pf);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += 16;
                p1 += 16;
                p2 += 16;
                p3 += 16;
                p4 += 16;
                p5 += 16;
                p6 += 16;
                p7 += 16;
                p8 += 16;
                p9 += 16;
                pa += 16;
                pb += 16;
                pc += 16;
                pd += 16;
                pe += 16;
                pf += 16;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp[12] = pc[0];
                pp[13] = pd[0];
                pp[14] = pe[0];
                pp[15] = pf[0];
                pp += 16;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
                pc++;
                pd++;
                pe++;
                pf++;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 16, _r2);
                _mm256_store_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}